

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  Instruction *pIVar1;
  anon_union_8_4_e6d17769_for_u aVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int *l1;
  OpCode op_00;
  Instruction i;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar4 = constfolding(fs,op,e1,e2);
    if (iVar4 != 0) {
      return;
    }
    op_00 = op + OPR_EQ;
    goto LAB_00121074;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if (e2->k == VRELOCABLE) {
      pIVar1 = fs->f->code;
      lVar5 = (long)(e2->u).info;
      uVar6 = pIVar1[lVar5];
      if ((uVar6 & 0x3f) == 0x1d) {
        if (((e1->k == VNONRELOC) && (((uint)(e1->u).info >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (e1->u).info)) {
          fs->freereg = fs->freereg + 0xff;
          lVar5 = (long)(e2->u).info;
          uVar6 = pIVar1[lVar5];
        }
        pIVar1[lVar5] = (e1->u).info << 0x17 | uVar6 & 0x7fffff;
        e1->k = VRELOCABLE;
        (e1->u).info = (e2->u).info;
        return;
      }
    }
    luaK_exp2nextreg(fs,e2);
    op_00 = OP_CONCAT;
LAB_00121074:
    codebinexpval(fs,op_00,e1,e2,line);
    return;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    uVar6 = (e1->u).info | 0x100;
    if (e1->k != VK) {
      uVar6 = (e1->u).info;
    }
    iVar4 = luaK_exp2RK(fs,e2);
    freeexps(fs,e1,e2);
    if (op - OPR_GT < 2) {
      i = uVar6 << 0xe | iVar4 << 0x17 | op + OPR_LE | 0x40;
    }
    else if (op == OPR_NE) {
      i = iVar4 << 0xe | uVar6 << 0x17 | 0x1f;
    }
    else {
      i = iVar4 << 0xe | op + OPR_GE | uVar6 << 0x17 | 0x40;
    }
    luaK_code(fs,i);
    iVar4 = luaK_jump(fs);
    (e1->u).info = iVar4;
    e1->k = VJMP;
    return;
  case OPR_AND:
    luaK_dischargevars(fs,e2);
    l1 = &e2->f;
    iVar4 = e1->f;
    break;
  case OPR_OR:
    luaK_dischargevars(fs,e2);
    l1 = &e2->t;
    iVar4 = e1->t;
    break;
  default:
    goto switchD_0012104f_default;
  }
  luaK_concat(fs,l1,iVar4);
  iVar4 = e2->f;
  e1->t = e2->t;
  e1->f = iVar4;
  uVar3 = *(undefined4 *)&e2->field_0x4;
  aVar2 = e2->u;
  e1->k = e2->k;
  *(undefined4 *)&e1->field_0x4 = uVar3;
  e1->u = aVar2;
switchD_0012104f_default:
  return;
}

Assistant:

void luaK_posfix(FuncState *fs, BinOpr op,
                 expdesc *e1, expdesc *e2, int line) {
    switch (op) {
        case OPR_AND: {
            lua_assert(e1->t == NO_JUMP);  /* list closed by 'luK_infix' */
            luaK_dischargevars(fs, e2);
            luaK_concat(fs, &e2->f, e1->f);
            *e1 = *e2;
            break;
        }
        case OPR_OR: {
            lua_assert(e1->f == NO_JUMP);  /* list closed by 'luK_infix' */
            luaK_dischargevars(fs, e2);
            luaK_concat(fs, &e2->t, e1->t);
            *e1 = *e2;
            break;
        }
        case OPR_CONCAT: {
            luaK_exp2val(fs, e2);
            if (e2->k == VRELOCABLE &&
                GET_OPCODE(getinstruction(fs, e2)) == OP_CONCAT) {
                lua_assert(e1->u.info == GETARG_B(getinstruction(fs, e2)) - 1);
                freeexp(fs, e1);
                SETARG_B(getinstruction(fs, e2), e1->u.info);
                e1->k = VRELOCABLE;
                e1->u.info = e2->u.info;
            } else {
                luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
                codebinexpval(fs, OP_CONCAT, e1, e2, line);
            }
            break;
        }
        case OPR_ADD:
        case OPR_SUB:
        case OPR_MUL:
        case OPR_DIV:
        case OPR_IDIV:
        case OPR_MOD:
        case OPR_POW:
        case OPR_BAND:
        case OPR_BOR:
        case OPR_BXOR:
        case OPR_SHL:
        case OPR_SHR: {
            if (!constfolding(fs, op + LUA_OPADD, e1, e2))
                codebinexpval(fs, cast(OpCode, op + OP_ADD), e1, e2, line);
            break;
        }
        case OPR_EQ:
        case OPR_LT:
        case OPR_LE:
        case OPR_NE:
        case OPR_GT:
        case OPR_GE: {
            codecomp(fs, op, e1, e2);
            break;
        }
        default:
            lua_assert(0);
    }
}